

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_fullgc(lua_State *L,int isemergency)

{
  lu_byte lVar1;
  global_State *g;
  
  g = L->l_G;
  g->gcemergency = (lu_byte)isemergency;
  lVar1 = g->gckind;
  if (lVar1 == '\0') {
    fullinc(L,g);
  }
  else if (lVar1 == '\x02') {
    g->gckind = '\0';
    fullinc(L,g);
    g->gckind = '\x02';
  }
  else if (lVar1 == '\x01') {
    minor2inc(L,g,'\0');
    entergen(L,g);
  }
  g->gcemergency = '\0';
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = cast_byte(isemergency);  /* set flag */
  switch (g->gckind) {
    case KGC_GENMINOR: fullgen(L, g); break;
    case KGC_INC: fullinc(L, g); break;
    case KGC_GENMAJOR:
      g->gckind = KGC_INC;
      fullinc(L, g);
      g->gckind = KGC_GENMAJOR;
      break;
  }
  g->gcemergency = 0;
}